

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O1

ArgumentInfo *
JitFFI::SysV64::GetArgInfo
          (ArgumentInfo *__return_storage_ptr__,ArgTypeUnit *restype,ArgTypeList *atlist)

{
  ArgTypeUnit *atu;
  ArgumentInfo *pAVar1;
  OP t0;
  OP t1;
  StructTypeData SVar2;
  uint uVar3;
  undefined4 *puVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  _List_node_base *p_Var9;
  StructBaseData local_49;
  void *local_48;
  undefined4 *local_40;
  ArgumentInfo *local_38;
  
  local_38 = __return_storage_ptr__;
  puVar4 = (undefined4 *)operator_new(0x18);
  uVar5 = (atlist->
          super__List_base<const_JitFFI::ArgTypeUnit_*,_std::allocator<const_JitFFI::ArgTypeUnit_*>_>
          )._M_impl._M_node._M_size;
  if (0xfffffffe < uVar5) {
    __assert_fail("atlist.size() < UINT32_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-def.h"
                  ,0xa2,
                  "ArgTypeInfo JitFFI::create_argtypeinfo(const ArgTypeUnit &, const ArgTypeList &) [ArgTypeInfo = JitFFI::SysV64::ArgTypeInfo, ArgPassData = JitFFI::SysV64::ArgTypeInfo::PassData, ArgRetData = JitFFI::SysV64::ArgTypeInfo::RetData, pass_f = &JitFFI::SysV64::get_argtypeinfo_pass_data, ret_f = &JitFFI::SysV64::get_argtypeinfo_ret_data]"
                 );
  }
  *puVar4 = (int)uVar5;
  puVar4[1] = 0;
  local_48 = malloc(uVar5 * 4);
  *(void **)(puVar4 + 2) = local_48;
  *(ulong *)(puVar4 + 4) = uVar5;
  uVar7 = (restype->super_ArgTypeUnitBase).type;
  if (9 < uVar7 - 1) {
    __assert_fail("AT_Unknown < type && type < AT_Over",
                  "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                  ,0x122,"JitFFI::SysV64::ArgTypeInfo::RetData::RetData(ArgTypeIndex, uint16_t)");
  }
  uVar8 = (restype->super_ArgTypeUnitBase).size;
  local_40 = puVar4;
  if (uVar7 == 2) {
    uVar3 = 10;
    if (0x10 < uVar8) {
      SVar2.super_StructBaseData = (StructBaseData)0x0;
      goto LAB_0010ae28;
    }
    SVar2 = get_argstructtypeinfo(restype);
    if ((((byte)SVar2.super_StructBaseData & 0xf) == 10) ||
       (((byte)SVar2.super_StructBaseData & 0xf0) == 0xa0)) goto LAB_0010ae28;
  }
  else {
    SVar2.super_StructBaseData = (StructBaseData)0x0;
  }
  uVar3 = uVar7;
LAB_0010ae28:
  puVar4[1] = uVar3 & 0xff | (uint)(byte)SVar2.super_StructBaseData << 8 | uVar8 << 0x10;
  p_Var9 = (atlist->
           super__List_base<const_JitFFI::ArgTypeUnit_*,_std::allocator<const_JitFFI::ArgTypeUnit_*>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)atlist) {
    uVar7 = 0;
    do {
      atu = (ArgTypeUnit *)p_Var9[1]._M_next;
      switch((atu->super_ArgTypeUnitBase).type) {
      case 2:
        uVar8 = (atu->super_ArgTypeUnitBase).size;
        if (0x10 < uVar8) goto LAB_0010ae73;
        SVar2 = get_argstructtypeinfo(atu);
        t0 = get_pass_type((uint)((byte)SVar2.super_StructBaseData & 0xf));
        t1 = get_pass_type((uint)((byte)SVar2.super_StructBaseData >> 4));
        ArgTypeInfo::StructBaseData::StructBaseData(&local_49,t0,t1);
        uVar3 = (uint)(byte)local_49 << 8;
        uVar6 = 4 - (((byte)local_49 & 0xf0) == 0x30 || ((byte)local_49 & 0xf) == 3);
        break;
      case 3:
        uVar8 = (atu->super_ArgTypeUnitBase).size;
        uVar3 = 0;
        uVar6 = 1;
        break;
      case 4:
        uVar8 = (atu->super_ArgTypeUnitBase).size;
        uVar3 = 0;
        uVar6 = 2;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                      ,0x167,
                      "ArgTypeInfo::PassData JitFFI::SysV64::get_argtypeinfo_pass_data(const ArgTypeUnit &)"
                     );
      case 6:
      case 7:
      case 8:
      case 10:
        uVar8 = (atu->super_ArgTypeUnitBase).size;
LAB_0010ae73:
        uVar3 = 0;
        uVar6 = 3;
      }
      uVar5 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
      *(uint *)((long)local_48 + uVar5 * 4) = uVar8 << 0x10 | uVar6 | uVar3;
      p_Var9 = (((_List_base<const_JitFFI::ArgTypeUnit_*,_std::allocator<const_JitFFI::ArgTypeUnit_*>_>
                  *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var9 != (_List_node_base *)atlist);
  }
  pAVar1 = local_38;
  local_38->_platform = P_SysV64;
  (local_38->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JitFFI::SysV64::ArgTypeInfo*,JitFFI::ArgumentInfo::ArgumentInfo<JitFFI::SysV64::ArgTypeInfo>(JitFFI::Platform,JitFFI::SysV64::ArgTypeInfo*)::_lambda(void*)_1_,std::allocator<void>,void>
            (&(local_38->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return pAVar1;
}

Assistant:

ArgumentInfo GetArgInfo(const ArgTypeUnit &restype, const ArgTypeList &atlist) {
			ArgTypeInfo *p_ati = new ArgTypeInfo(create_argtypeinfo(restype, atlist));
			return ArgumentInfo(P_SysV64, p_ati);
		}